

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O2

void duckdb::ReadDataFromPrimitiveSegment<unsigned_char>
               (ListSegmentFunctions *param_1,ListSegment *segment,Vector *result,idx_t *total_count
               )

{
  data_ptr_t pdVar1;
  bool bVar2;
  ulong uVar3;
  idx_t i;
  ulong uVar4;
  
  FlatVector::VerifyFlatVector(result);
  for (uVar4 = 0; uVar3 = (ulong)segment->count, uVar4 < uVar3; uVar4 = uVar4 + 1) {
    if (*(char *)((long)&segment[1].count + uVar4) == '\x01') {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,*total_count + uVar4
                );
    }
  }
  pdVar1 = result->data;
  for (uVar4 = 0; uVar4 < uVar3; uVar4 = uVar4 + 1) {
    bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                       *total_count + uVar4);
    if (bVar2) {
      pdVar1[uVar4 + *total_count] =
           *(data_t *)((long)&segment[1].count + segment->capacity + uVar4);
    }
    uVar3 = (ulong)segment->count;
  }
  return;
}

Assistant:

static void ReadDataFromPrimitiveSegment(const ListSegmentFunctions &, const ListSegment *segment, Vector &result,
                                         idx_t &total_count) {

	auto &aggr_vector_validity = FlatVector::Validity(result);

	// set NULLs
	auto null_mask = GetNullMask(segment);
	for (idx_t i = 0; i < segment->count; i++) {
		if (null_mask[i]) {
			aggr_vector_validity.SetInvalid(total_count + i);
		}
	}

	auto aggr_vector_data = FlatVector::GetData<T>(result);

	// load values
	for (idx_t i = 0; i < segment->count; i++) {
		if (aggr_vector_validity.RowIsValid(total_count + i)) {
			auto data = GetPrimitiveData<T>(segment);
			aggr_vector_data[total_count + i] = Load<T>(const_data_ptr_cast(data + i));
		}
	}
}